

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

void __thiscall r_exec::PGMOverlay::reset(PGMOverlay *this)

{
  pointer puVar1;
  pointer pcVar2;
  EVP_PKEY_CTX *in_RSI;
  
  InputLessPGMOverlay::reset(&this->super_InputLessPGMOverlay);
  puVar1 = (this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::clear
            (&this->input_views);
  *(undefined4 *)&(this->input_pattern_indices).used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->input_pattern_indices).used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->input_pattern_indices).used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->input_pattern_indices).used_cells_tail + 4) = 0xffffffff;
  (this->input_pattern_indices).free_cells = -1;
  (this->input_pattern_indices).used_cell_count = 0;
  (this->input_pattern_indices).free_cell_count = 0;
  pcVar2 = (this->input_pattern_indices).cells.
           super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->input_pattern_indices).cells.
      super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (this->input_pattern_indices).cells.
    super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  init(this,in_RSI);
  return;
}

Assistant:

inline void PGMOverlay::reset()
{
    InputLessPGMOverlay::reset();
    patch_indices.clear();
    input_views.clear();
    input_pattern_indices.clear();
    init();
}